

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

void __thiscall QIconLoader::setThemeName(QIconLoader *this,QString *themeName)

{
  bool bVar1;
  QString *in_RSI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  bool hadUserTheme;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint uVar2;
  QLoggingCategory *this_00;
  QDebug *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = ::operator==((QString *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (QString *)in_RDI);
  if (!bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x29d8c6);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RSI,in_stack_ffffffffffffff94,(char *)in_RDI,
                 (char *)0x29d8dc);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd8);
      QDebug::operator<<((QDebug *)this_00,in_RSI);
      QDebug::~QDebug(&local_20);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    bVar1 = hasUserTheme((QIconLoader *)0x29d923);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
    QString::operator=((QString *)&in_RDI[1].name,(QString *)in_RSI);
    bVar1 = hasUserTheme((QIconLoader *)0x29d944);
    if ((!bVar1) && ((uVar2 & 0x1000000) != 0)) {
      systemIconSearchPaths();
      setThemeSearchPath((QIconLoader *)CONCAT44(uVar2,in_stack_ffffffffffffff90),
                         (QStringList *)in_RDI);
      QList<QString>::~QList((QList<QString> *)0x29d971);
    }
    invalidateKey((QIconLoader *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconLoader::setThemeName(const QString &themeName)
{
    if (m_userTheme == themeName)
        return;

    qCDebug(lcIconLoader) << "Setting user theme name to" << themeName;

    const bool hadUserTheme = hasUserTheme();
    m_userTheme = themeName;
    // if we cleared the user theme, then reset search paths as well,
    // otherwise we'll keep looking in the user-defined search paths for
    // a system-provide theme, which will never work.
    if (!hasUserTheme() && hadUserTheme)
        setThemeSearchPath(systemIconSearchPaths());
    invalidateKey();
}